

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseThread.cpp
# Opt level: O2

void __thiscall BaseThread::Start(BaseThread *this,int detach)

{
  BaseThread *local_38;
  thread local_30;
  type local_28 [2];
  
  local_28[0] = 1;
  local_28[1] = 0;
  local_38 = this;
  std::thread::thread<void(BaseThread::*)(),BaseThread*,void>(&local_30,local_28,&local_38);
  std::thread::operator=(&this->thread,&local_30);
  std::thread::~thread(&local_30);
  if (detach != 0) {
    std::thread::detach();
  }
  return;
}

Assistant:

void BaseThread::Start(int detach) {
    thread = std::thread(&BaseThread::Run, this);

    if(detach) {
        thread.detach();
    }
}